

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O0

RealType __thiscall
QuantLib::Problem::DotProduct
          (Problem *this,DynamicVector<double,_std::allocator<double>_> *v1,
          DynamicVector<double,_std::allocator<double>_> *v2)

{
  DynamicVector<double,_std::allocator<double>_> *in_RDI;
  double dVar1;
  DynamicVector<double,_std::allocator<double>_> *unaff_retaddr;
  RealType dp;
  
  dVar1 = OpenMD::dot<double>(unaff_retaddr,in_RDI);
  return dVar1;
}

Assistant:

RealType Problem::DotProduct(DynamicVector<RealType>& v1,
                               DynamicVector<RealType>& v2) {
    RealType dp = dot(v1, v2);
    return dp;
  }